

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  ostream *poVar2;
  element_type *peVar3;
  void *this;
  undefined1 local_c0 [8];
  shared_ptr<IElement> tree;
  ostream_iterator<Token,_char,_std::char_traits<char>_> local_a0;
  Token *local_90;
  __normal_iterator<const_Token_*,_std::vector<Token,_std::allocator<Token>_>_> local_88;
  string local_80;
  undefined1 local_60 [8];
  vector<Token,_std::allocator<Token>_> res;
  allocator<char> local_31;
  string local_30 [8];
  string input;
  
  input.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"(13 - 4) - (12 + 1)",&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::__cxx11::string::string((string *)&local_80,local_30);
  lex((vector<Token,_std::allocator<Token>_> *)local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  local_88._M_current =
       (Token *)std::vector<Token,_std::allocator<Token>_>::cbegin
                          ((vector<Token,_std::allocator<Token>_> *)local_60);
  local_90 = (Token *)std::vector<Token,_std::allocator<Token>_>::cend
                                ((vector<Token,_std::allocator<Token>_> *)local_60);
  std::ostream_iterator<Token,_char,_std::char_traits<char>_>::ostream_iterator
            (&local_a0,(ostream_type *)&std::cout," ");
  std::
  copy<__gnu_cxx::__normal_iterator<Token_const*,std::vector<Token,std::allocator<Token>>>,std::ostream_iterator<Token,char,std::char_traits<char>>>
            ((__normal_iterator<const_Token_*,_std::vector<Token,_std::allocator<Token>_>_>)
             &tree.super___shared_ptr<IElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount,local_88,
             (ostream_iterator<Token,_char,_std::char_traits<char>_> *)local_90);
  parse((vector<Token,_std::allocator<Token>_> *)local_c0);
  poVar2 = std::operator<<((ostream *)&std::cout,local_30);
  poVar2 = std::operator<<(poVar2," = ");
  peVar3 = std::__shared_ptr_access<IElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<IElement,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_c0);
  iVar1 = (**peVar3->_vptr_IElement)();
  this = (void *)std::ostream::operator<<(poVar2,iVar1);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  input.field_2._12_4_ = 0;
  std::shared_ptr<IElement>::~shared_ptr((shared_ptr<IElement> *)local_c0);
  std::vector<Token,_std::allocator<Token>_>::~vector
            ((vector<Token,_std::allocator<Token>_> *)local_60);
  std::__cxx11::string::~string(local_30);
  return input.field_2._12_4_;
}

Assistant:

int main()
{
	std::string input{"(13 - 4) - (12 + 1)"};
	auto res{lex(input)};
	std::copy(res.cbegin(), res.cend(), std::ostream_iterator<decltype(res)::value_type>(std::cout, " "));
	auto tree{parse(res)};
	std::cout << input << " = " << tree->eval() << std::endl;

	return 0;
}